

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yocto_obj.h
# Opt level: O2

int yo__vector_capacity(int s)

{
  uint uVar1;
  
  if (s != 0) {
    uVar1 = s - 1U >> 1 | s - 1U;
    uVar1 = uVar1 >> 2 | uVar1;
    uVar1 = uVar1 >> 4 | uVar1;
    uVar1 = uVar1 >> 8 | uVar1;
    return (uVar1 >> 0x10 | uVar1) + 1;
  }
  return 0;
}

Assistant:

static inline int
yo__vector_capacity(int s) {
    if (!s) return 0;
    // round to next pow2
    // http://graphics.stanford.edu/~seander/bithacks.html#RoundUpPowerOf2
    uint32_t n = s;
    n--;
    n |= n >> 1;
    n |= n >> 2;
    n |= n >> 4;
    n |= n >> 8;
    n |= n >> 16;
    n++;
    return n;
}